

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Node * prvTidyParsePre(TidyDocImpl *doc,Node *pre,GetTokenMode mode)

{
  TidyParserMemory *pTVar1;
  Dict *pDVar2;
  Node *pNVar3;
  Bool BVar4;
  long lVar5;
  Node *node;
  Node *node_00;
  Node **ppNVar6;
  TidyTagId TVar7;
  Node *pNVar8;
  int iVar9;
  int iVar10;
  TidyParserMemory memory;
  undefined8 uStack_50;
  
  if (pre == (Node *)0x0) {
    iVar10 = (doc->stack).top;
    lVar5 = (long)iVar10;
    if (lVar5 < 0) {
      pre = (Node *)0x0;
      pNVar8 = (Node *)0x0;
      iVar9 = 0;
    }
    else {
      pTVar1 = (doc->stack).content;
      pre = pTVar1[lVar5].original_node;
      pNVar8 = pTVar1[lVar5].reentry_node;
      iVar9 = pTVar1[lVar5].reentry_state;
      (doc->stack).top = iVar10 + -1;
    }
  }
  else {
    pNVar8 = (Node *)0x0;
    iVar9 = 0;
    if ((pre->tag->model & 1) != 0) {
      return (Node *)0x0;
    }
  }
  prvTidyInlineDup(doc,(Node *)0x0);
LAB_0013ebae:
  do {
    do {
      do {
        while( true ) {
          iVar10 = iVar9;
          if (iVar10 == 0) {
            node = prvTidyGetToken(doc,Preformatted);
          }
          else {
            node = pNVar8;
            if (iVar10 == 2) {
              prvTidyReport(doc,pre,pNVar8,0x25a);
              return (Node *)0x0;
            }
          }
          pNVar8 = node;
          if (iVar10 != 1) break;
          node_00 = prvTidyInferredTag(doc,TidyTag_PRE);
          prvTidyReport(doc,pre,node_00,0x247);
          pNVar3 = node->parent;
          node_00->parent = pNVar3;
          if ((pNVar3 == (Node *)0x0) || (pNVar3->last != node)) {
            pNVar3 = node->next;
            node_00->next = pNVar3;
            if (pNVar3 != (Node *)0x0) {
              ppNVar6 = &pNVar3->prev;
              goto LAB_0013ec68;
            }
          }
          else {
            ppNVar6 = &pNVar3->last;
LAB_0013ec68:
            *ppNVar6 = node_00;
          }
          node->next = node_00;
          node_00->prev = node;
          pre = node_00;
          iVar9 = 0;
        }
        iVar9 = iVar10;
      } while (iVar10 != 0);
      pNVar8 = (Node *)0x0;
      iVar9 = 2;
    } while (node == (Node *)0x0);
    if (node->type == EndTag) {
      pDVar2 = node->tag;
      if (pDVar2 != pre->tag) {
        if (pDVar2 == (Dict *)0x0) {
          TVar7 = TidyTag_UNKNOWN;
        }
        else {
          TVar7 = pDVar2->id;
        }
        for (pNVar8 = pre->parent; pNVar8 != (Node *)0x0; pNVar8 = pNVar8->parent) {
          if ((pNVar8->tag != (Dict *)0x0) && (pNVar8->tag->id == TVar7)) goto LAB_0013ed75;
        }
        goto LAB_0013eca2;
      }
LAB_0013ed75:
      if ((pDVar2 != (Dict *)0x0) &&
         ((pDVar2->id == TidyTag_BODY || ((pDVar2 != (Dict *)0x0 && (pDVar2->id == TidyTag_HTML)))))
         ) goto LAB_0013edd9;
      if (pDVar2 == pre->tag) {
        prvTidyFreeNode(doc,node);
      }
      else {
        prvTidyReport(doc,pre,node,0x259);
        prvTidyUngetToken(doc);
      }
      pre->closed = yes;
LAB_0013eec7:
      TrimSpaces(doc,pre);
      return (Node *)0x0;
    }
LAB_0013eca2:
    BVar4 = prvTidynodeIsText(node);
    if (BVar4 != no) {
LAB_0013ecae:
      node->parent = pre;
      if (pre == (Node *)0x0) {
        node->prev = (Node *)0x0;
LAB_0013ed9e:
        pNVar8 = node;
        iVar9 = iVar10;
        if (pre == (Node *)0x0) goto LAB_0013ebae;
        ppNVar6 = &pre->content;
      }
      else {
        pNVar8 = pre->last;
        node->prev = pNVar8;
        if (pNVar8 == (Node *)0x0) goto LAB_0013ed9e;
        ppNVar6 = &pNVar8->next;
      }
      *ppNVar6 = node;
      pNVar8 = node;
      iVar9 = iVar10;
      if (pre != (Node *)0x0) {
        pre->last = node;
      }
      goto LAB_0013ebae;
    }
    BVar4 = InsertMisc(pre,node);
    pNVar8 = node;
    iVar9 = iVar10;
    if (BVar4 == no) {
      if (node->tag == (Dict *)0x0) goto LAB_0013edd9;
      if (((node->tag->id != TidyTag_P) && (BVar4 = prvTidynodeIsText(node), BVar4 == no)) &&
         ((node->tag == (Dict *)0x0 ||
          ((node->tag->id == TidyTag_PARAM || (BVar4 = prvTidynodeHasCM(node,0x100010), BVar4 == no)
           ))))) {
        if (node->type != EndTag) {
          BVar4 = prvTidynodeHasCM(node,0x280);
          if ((BVar4 != no) || ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_TABLE)))) {
            if (doc->lexer->exiled == no) {
              prvTidyReport(doc,pre,node,0x259);
            }
            prvTidyUngetToken(doc);
            return (Node *)0x0;
          }
          pNVar8 = pre->parent;
          node->parent = pNVar8;
          if ((pNVar8 == (Node *)0x0) || (pNVar8->last != pre)) {
            pNVar8 = pre->next;
            node->next = pNVar8;
            if (pNVar8 != (Node *)0x0) {
              ppNVar6 = &pNVar8->prev;
              goto LAB_0013eff5;
            }
          }
          else {
            ppNVar6 = &pNVar8->last;
LAB_0013eff5:
            *ppNVar6 = node;
          }
          pre->next = node;
          node->prev = pre;
          prvTidyReport(doc,pre,node,0x259);
          uStack_50 = 0x100000000;
LAB_0013ef58:
          prvTidypushMemory(doc,(TidyParserMemory)
                                ZEXT3248(CONCAT824(uStack_50,
                                                   CONCAT816(node,CONCAT88(pre,prvTidyParsePre)))));
          return node;
        }
        if ((doc->lexer->exiled == no) ||
           ((BVar4 = prvTidynodeHasCM(node,0x80), BVar4 == no &&
            ((node->tag == (Dict *)0x0 || (node->tag->id != TidyTag_TABLE)))))) goto LAB_0013edd9;
        prvTidyUngetToken(doc);
        goto LAB_0013eec7;
      }
      if ((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_P)) {
        BVar4 = prvTidynodeIsElement(node);
        if (BVar4 != no) {
          if ((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_BR)) {
            TrimSpaces(doc,pre);
          }
          node->parent = pre;
          if (pre == (Node *)0x0) {
            node->prev = (Node *)0x0;
LAB_0013ef13:
            if (pre != (Node *)0x0) {
              ppNVar6 = &pre->content;
              goto LAB_0013ef1c;
            }
          }
          else {
            pNVar8 = pre->last;
            node->prev = pNVar8;
            if (pNVar8 == (Node *)0x0) goto LAB_0013ef13;
            ppNVar6 = &pNVar8->next;
LAB_0013ef1c:
            *ppNVar6 = node;
            if (pre != (Node *)0x0) {
              pre->last = node;
            }
          }
          uStack_50 = 0;
          goto LAB_0013ef58;
        }
      }
      else if (node->type == StartTag) {
        prvTidyReport(doc,pre,node,0x28e);
        TrimSpaces(doc,pre);
        prvTidyCoerceNode(doc,node,TidyTag_BR,no,no);
        prvTidyFreeAttrs(doc,node);
        goto LAB_0013ecae;
      }
LAB_0013edd9:
      prvTidyReport(doc,pre,node,0x235);
      prvTidyFreeNode(doc,node);
      pNVar8 = node;
      iVar9 = iVar10;
    }
  } while( true );
}

Assistant:

Node* TY_(ParsePre)( TidyDocImpl* doc, Node *pre, GetTokenMode ARG_UNUSED(mode) )
{
    Node *node = NULL;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_RENTRY_ACTION,          /* To-do after re-entering after checks. */
        STATE_COMPLETE,               /* Done with the switch. */
    } state = STATE_INITIAL;


    if ( pre == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        pre = memory.original_node;
        state = memory.reentry_state;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(pre);
        if (pre->tag->model & CM_EMPTY)
        {
            DEBUG_LOG_EXIT;
            return NULL;
        }
    }

    TY_(InlineDup)( doc, NULL ); /* tell lexer to insert inlines if needed */

    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL )
            node = TY_(GetToken)(doc, Preformatted);
        
        switch ( state )
        {
            case STATE_INITIAL:
            {
                if ( node == NULL )
                {
                    state = STATE_COMPLETE;
                    continue;
                }
                
                if ( node->type == EndTag &&
                     (node->tag == pre->tag || DescendantOf(pre, TagId(node))) )
                {
                    if (nodeIsBODY(node) || nodeIsHTML(node))
                    {
                        TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)(doc, node);
                        continue;
                    }
                    if (node->tag == pre->tag)
                    {
                        TY_(FreeNode)(doc, node);
                    }
                    else
                    {
                        TY_(Report)(doc, pre, node, MISSING_ENDTAG_BEFORE );
                        TY_(UngetToken)( doc );
                    }
                    pre->closed = yes;
                    TrimSpaces(doc, pre);
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                if (TY_(nodeIsText)(node))
                {
                    TY_(InsertNodeAtEnd)(pre, node);
                    continue;
                }

                /* deal with comments etc. */
                if (InsertMisc(pre, node))
                    continue;

                if (node->tag == NULL)
                {
                    TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)(doc, node);
                    continue;
                }

                /* strip unexpected tags */
                if ( !PreContent(doc, node) )
                {
                    /* fix for http://tidy.sf.net/bug/772205 */
                    if (node->type == EndTag)
                    {
                        /* http://tidy.sf.net/issue/1590220 */
                       if ( doc->lexer->exiled
                           && (TY_(nodeHasCM)(node, CM_TABLE) || nodeIsTABLE(node)) )
                       {
                          TY_(UngetToken)(doc);
                          TrimSpaces(doc, pre);
                           DEBUG_LOG_EXIT;
                          return NULL;
                       }

                       TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                       TY_(FreeNode)(doc, node);
                       continue;
                    }
                    /* http://tidy.sf.net/issue/1590220 */
                    else if (TY_(nodeHasCM)(node, CM_TABLE|CM_ROW)
                             || nodeIsTABLE(node) )
                    {
                        if (!doc->lexer->exiled)
                            /* No missing close warning if exiled. */
                            TY_(Report)(doc, pre, node, MISSING_ENDTAG_BEFORE);

                        TY_(UngetToken)(doc);
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    /*
                      This is basically what Tidy 04 August 2000 did and far more accurate
                      with respect to browser behaivour than the code commented out above.
                      Tidy could try to propagate the <pre> into each disallowed child where
                      <pre> is allowed in order to replicate some browsers behaivour, but
                      there are a lot of exceptions, e.g. Internet Explorer does not propagate
                      <pre> into table cells while Mozilla does. Opera 6 never propagates
                      <pre> into blocklevel elements while Opera 7 behaves much like Mozilla.

                      Tidy behaves thus mostly like Opera 6 except for nested <pre> elements
                      which are handled like Mozilla takes them (Opera6 closes all <pre> after
                      the first </pre>).

                      There are similar issues like replacing <p> in <pre> with <br>, for
                      example

                        <pre>...<p>...</pre>                 (Input)
                        <pre>...<br>...</pre>                (Tidy)
                        <pre>...<br>...</pre>                (Opera 7 and Internet Explorer)
                        <pre>...<br><br>...</pre>            (Opera 6 and Mozilla)

                        <pre>...<p>...</p>...</pre>          (Input)
                        <pre>...<br>......</pre>             (Tidy, BUG!)
                        <pre>...<br>...<br>...</pre>         (Internet Explorer)
                        <pre>...<br><br>...<br><br>...</pre> (Mozilla, Opera 6)
                        <pre>...<br>...<br><br>...</pre>     (Opera 7)

                      or something similar, they could also be closing the <pre> and propagate
                      the <pre> into the newly opened <p>.

                      Todo: IMG, OBJECT, APPLET, BIG, SMALL, SUB, SUP, FONT, and BASEFONT are
                      disallowed in <pre>, Tidy neither detects this nor does it perform any
                      cleanup operation. Tidy should at least issue a warning if it encounters
                      such constructs.

                      Todo: discarding </p> is abviously a bug, it should be replaced by <br>.
                    */
                    TY_(InsertNodeAfterElement)(pre, node);
                    TY_(Report)(doc, pre, node, MISSING_ENDTAG_BEFORE);
                    
                    {
                        TidyParserMemory memory = {0};
                        memory.identity = TY_(ParsePre);
                        memory.original_node = pre;
                        memory.reentry_node = node;
                        memory.reentry_state = STATE_RENTRY_ACTION;
                        TY_(pushMemory)( doc, memory );
                        DEBUG_LOG_EXIT_WITH_NODE(node);
                        return node;
                    }
                }

                if ( nodeIsP(node) )
                {
                    if (node->type == StartTag)
                    {
                        TY_(Report)(doc, pre, node, USING_BR_INPLACE_OF);

                        /* trim white space before <p> in <pre>*/
                        TrimSpaces(doc, pre);

                        /* coerce both <p> and </p> to <br> */
                        TY_(CoerceNode)(doc, node, TidyTag_BR, no, no);
                        TY_(FreeAttrs)( doc, node ); /* discard align attribute etc. */
                        TY_(InsertNodeAtEnd)( pre, node );
                    }
                    else
                    {
                        TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                    }
                    continue;
                }

                if ( TY_(nodeIsElement)(node) )
                {
                    /* trim white space before <br> */
                    if ( nodeIsBR(node) )
                        TrimSpaces(doc, pre);

                    TY_(InsertNodeAtEnd)(pre, node);
                    
                    {
                        TidyParserMemory memory = {0};
                        memory.identity = TY_(ParsePre);
                        memory.original_node = pre;
                        memory.reentry_node = node;
                        memory.reentry_state = STATE_INITIAL;
                        TY_(pushMemory)( doc, memory );
                        DEBUG_LOG_EXIT_WITH_NODE(node);
                        return node;
                    }
                }

                /* discard unexpected tags */
                TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            } break;
                
            case STATE_RENTRY_ACTION:
            {
                Node* newnode = TY_(InferredTag)(doc, TidyTag_PRE);
                TY_(Report)(doc, pre, newnode, INSERTING_TAG);
                pre = newnode;
                TY_(InsertNodeAfterElement)(node, pre);
                state = STATE_INITIAL;
                continue;
            } break;
            
            default:
                break;

        } /* switch */
    } /* while */

    TY_(Report)(doc, pre, node, MISSING_ENDTAG_FOR);
    DEBUG_LOG_EXIT;
    return NULL;
}